

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscUtil.c
# Opt level: O2

Gia_Man_t * Gia_ManDropContained(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int Entry;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  sat_solver *s;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar5;
  long lVar6;
  int iVar7;
  
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,p->vCos->nSize - p->nRegs);
  iVar7 = 0;
  Entry = Abc_Var2Lit(*p_00->pVarNums,0);
  Aig_ManStop(pAig);
  p_01 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
  while ((iVar7 < p->vCos->nSize - p->nRegs &&
         (pGVar4 = Gia_ManCo(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
    pGVar1 = p->pObjs;
    if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Abc_Var2Lit(p_00->pVarNums[(int)(((long)pGVar4 - (long)pGVar1) / 0xc)],1);
    Vec_IntPush(p_01,iVar2);
    iVar7 = iVar7 + 1;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  lVar6 = 0;
  do {
    if (p_00->nClauses <= lVar6) {
      Cnf_DataFree(p_00);
      iVar7 = sat_solver_simplify(s);
      if (iVar7 != 0) {
        p_02 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
        iVar7 = 0;
        while ((iVar7 < p->vCos->nSize - p->nRegs &&
               (pGVar4 = Gia_ManCo(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
          iVar2 = Vec_IntEntry(p_01,iVar7);
          iVar2 = Abc_LitNot(iVar2);
          Vec_IntWriteEntry(p_01,iVar7,iVar2);
          iVar2 = sat_solver_solve(s,p_01->pArray,p_01->pArray + p_01->nSize,0,0,0,0);
          iVar3 = Vec_IntEntry(p_01,iVar7);
          iVar3 = Abc_LitNot(iVar3);
          Vec_IntWriteEntry(p_01,iVar7,iVar3);
          if (iVar2 == -1) {
            Vec_IntWriteEntry(p_01,iVar7,Entry);
          }
          else {
            Vec_IntPush(p_02,iVar7);
          }
          iVar7 = iVar7 + 1;
        }
        sat_solver_delete(s);
        Vec_IntFree(p_01);
        if (p_02->nSize != p->vCos->nSize - p->nRegs) {
          pGVar5 = Gia_ManDupCones(p,p_02->pArray,p_02->nSize,0);
          Vec_IntFree(p_02);
          return pGVar5;
        }
        Vec_IntFree(p_02);
        pGVar5 = Gia_ManDup(p);
        return pGVar5;
      }
      goto LAB_004ace3d;
    }
    iVar7 = sat_solver_addclause(s,p_00->pClauses[lVar6],p_00->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
  } while (iVar7 != 0);
  Cnf_DataFree(p_00);
LAB_004ace3d:
  sat_solver_delete(s);
  Vec_IntFree(p_01);
  return (Gia_Man_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDropContained( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Man_t * pMan = Gia_ManToAigSimple( p );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, Gia_ManPoNum(p) );
    Gia_Obj_t * pObj;
    Vec_Int_t * vLits, * vKeep;
    sat_solver * pSat;
    int ConstLit = Abc_Var2Lit(pDat->pVarNums[0], 0);
    int i, status;//, Count = 0;
    Aig_ManStop( pMan );

    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        int iObj = Gia_ObjId( p, pObj );
        Vec_IntPush( vLits, Abc_Var2Lit(pDat->pVarNums[iObj], 1) );
    }

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            Vec_IntFree( vLits );
            return NULL;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        Vec_IntFree( vLits );
        return NULL;
    }

    // iterate over POs
    vKeep = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        if ( status == l_False )
            Vec_IntWriteEntry( vLits, i, ConstLit ); // const1 SAT var is always true
        else 
        {
            assert( status = l_True );
            Vec_IntPush( vKeep, i );
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( Vec_IntSize(vKeep) == Gia_ManPoNum(p) )
    {
        Vec_IntFree( vKeep );
        return Gia_ManDup(p);
    }
    pNew = Gia_ManDupCones( p, Vec_IntArray(vKeep), Vec_IntSize(vKeep), 0 );
    Vec_IntFree( vKeep );
    return pNew;
}